

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenerateDynCalls.cpp
# Opt level: O3

void __thiscall wasm::GenerateDynCalls::doWalkModule(GenerateDynCalls *this,Module *wasm)

{
  _List_node_base *p_Var1;
  
  Walker<wasm::GenerateDynCalls,_wasm::Visitor<wasm::GenerateDynCalls,_void>_>::doWalkModule
            (&(this->
              super_WalkerPass<wasm::PostWalker<wasm::GenerateDynCalls,_wasm::Visitor<wasm::GenerateDynCalls,_void>_>_>
              ).
              super_PostWalker<wasm::GenerateDynCalls,_wasm::Visitor<wasm::GenerateDynCalls,_void>_>
              .super_Walker<wasm::GenerateDynCalls,_wasm::Visitor<wasm::GenerateDynCalls,_void>_>,
             wasm);
  for (p_Var1 = (this->invokeTypes).List.
                super__List_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl._M_node.
                super__List_node_base._M_next;
      p_Var1 != (_List_node_base *)&(this->invokeTypes).List; p_Var1 = p_Var1->_M_next) {
    generateDynCallThunk(this,(HeapType)p_Var1[1]._M_next);
  }
  return;
}

Assistant:

void doWalkModule(Module* wasm) {
    PostWalker<GenerateDynCalls>::doWalkModule(wasm);
    for (auto& type : invokeTypes) {
      generateDynCallThunk(type);
    }
  }